

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::RenderGrid(CEditor *this,CLayerGroup *pGroup)

{
  int iVar1;
  int hex;
  int iVar2;
  int iVar3;
  CUIRect *pCVar4;
  IGraphics *pIVar5;
  int iVar6;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  vec4 vVar7;
  int i;
  int YGridOffset;
  int XGridOffset;
  int YOffset;
  int XOffset;
  int LineDistance;
  float h;
  float w;
  CLineItem Line;
  vec4 GridColor;
  float aGroupPoints [4];
  int local_b8;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  float fVar8;
  undefined4 in_stack_ffffffffffffff64;
  float fVar9;
  CLineItem local_88;
  vec4 local_78;
  vec4 local_68;
  CLineItem local_58;
  vec4 local_48;
  vec4 local_38;
  vector4_base<float> local_28;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_GridActive & 1U) != 0) {
    vector4_base<float>::vector4_base(&local_28);
    CLayerGroup::Mapping
              ((CLayerGroup *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (float *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    UI(in_RDI);
    pCVar4 = CUI::Screen((CUI *)in_RDI);
    fVar9 = pCVar4->w;
    UI(in_RDI);
    pCVar4 = CUI::Screen((CUI *)in_RDI);
    fVar8 = pCVar4->h;
    hex = GetLineDistance(in_RDI);
    iVar2 = (int)(local_18 / (float)hex);
    iVar3 = (int)(local_14 / (float)hex);
    iVar6 = iVar2 % in_RDI->m_GridFactor;
    iVar1 = in_RDI->m_GridFactor;
    Graphics(in_RDI);
    IGraphics::TextureClear((IGraphics *)in_RDI);
    pIVar5 = Graphics(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x14])();
    for (local_b8 = 0; local_b8 < (int)fVar9; local_b8 = local_b8 + 1) {
      if ((local_b8 + iVar3 % iVar1) % in_RDI->m_GridFactor == 0) {
        Config(in_RDI);
        vVar7 = HexToRgba(hex);
        local_38._0_8_ = vVar7._0_8_;
        local_28.field_0 = local_38.field_0;
        local_28.field_1 = local_38.field_1;
        local_38._8_8_ = vVar7._8_8_;
        local_28.field_2 = local_38.field_2;
        local_28.field_3 = local_38.field_3;
        local_38 = vVar7;
      }
      else {
        Config(in_RDI);
        vVar7 = HexToRgba(hex);
        local_48._0_8_ = vVar7._0_8_;
        local_28.field_0 = local_48.field_0;
        local_28.field_1 = local_48.field_1;
        local_48._8_8_ = vVar7._8_8_;
        local_28.field_2 = local_48.field_2;
        local_28.field_3 = local_48.field_3;
        local_48 = vVar7;
      }
      pIVar5 = Graphics(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
                (local_28._0_8_ & 0xffffffff,(ulong)local_28._0_8_ >> 0x20,local_28.field_2.z,
                 local_28.field_3.w);
      IGraphics::CLineItem::CLineItem
                (&local_58,(float)(hex * iVar2),(float)(hex * local_b8 + hex * iVar3),
                 fVar9 + local_10,(float)(hex * local_b8 + hex * iVar3));
      pIVar5 = Graphics(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x16])(pIVar5,&local_58,1);
      if ((local_b8 + iVar6) % in_RDI->m_GridFactor == 0) {
        Config(in_RDI);
        vVar7 = HexToRgba(hex);
        local_68._0_8_ = vVar7._0_8_;
        local_28.field_0 = local_68.field_0;
        local_28.field_1 = local_68.field_1;
        local_68._8_8_ = vVar7._8_8_;
        local_28.field_2 = local_68.field_2;
        local_28.field_3 = local_68.field_3;
        local_68 = vVar7;
      }
      else {
        Config(in_RDI);
        vVar7 = HexToRgba(hex);
        local_78._0_8_ = vVar7._0_8_;
        local_28.field_0 = local_78.field_0;
        local_28.field_1 = local_78.field_1;
        local_78._8_8_ = vVar7._8_8_;
        local_28.field_2 = local_78.field_2;
        local_28.field_3 = local_78.field_3;
        local_78 = vVar7;
      }
      pIVar5 = Graphics(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
                (local_28._0_8_ & 0xffffffff,(ulong)local_28._0_8_ >> 0x20,local_28.field_2.z,
                 local_28.field_3.w);
      IGraphics::CLineItem::CLineItem
                (&local_88,(float)(hex * local_b8 + hex * iVar2),(float)(hex * iVar3),
                 (float)(hex * local_b8 + hex * iVar2),fVar8 + local_c);
      local_58.m_X0 = local_88.m_X0;
      local_58.m_Y0 = local_88.m_Y0;
      local_58.m_X1 = local_88.m_X1;
      local_58.m_Y1 = local_88.m_Y1;
      pIVar5 = Graphics(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x16])(pIVar5,&local_58,1);
    }
    pIVar5 = Graphics(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
    pIVar5 = Graphics(in_RDI);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x15])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::RenderGrid(CLayerGroup *pGroup)
{
	if(!m_GridActive)
		return;

	vec4 GridColor;
	float aGroupPoints[4];
	pGroup->Mapping(aGroupPoints);

	float w = UI()->Screen()->w;
	float h = UI()->Screen()->h;

	int LineDistance = GetLineDistance();

	int XOffset = aGroupPoints[0]/LineDistance;
	int YOffset = aGroupPoints[1]/LineDistance;
	int XGridOffset = XOffset % m_GridFactor;
	int YGridOffset = YOffset % m_GridFactor;

	Graphics()->TextureClear();
	Graphics()->LinesBegin();

	for(int i = 0; i < (int)w; i++)
	{
		if((i+YGridOffset) % m_GridFactor == 0)
			GridColor = HexToRgba(Config()->m_EdColorGridOuter);
		else
			GridColor = HexToRgba(Config()->m_EdColorGridInner);

		Graphics()->SetColor(GridColor.r, GridColor.g, GridColor.b, GridColor.a);
		IGraphics::CLineItem Line = IGraphics::CLineItem(LineDistance*XOffset, LineDistance*i+LineDistance*YOffset, w+aGroupPoints[2], LineDistance*i+LineDistance*YOffset);
		Graphics()->LinesDraw(&Line, 1);

		if((i+XGridOffset) % m_GridFactor == 0)
			GridColor = HexToRgba(Config()->m_EdColorGridOuter);
		else
			GridColor = HexToRgba(Config()->m_EdColorGridInner);

		Graphics()->SetColor(GridColor.r, GridColor.g, GridColor.b, GridColor.a);
		Line = IGraphics::CLineItem(LineDistance*i+LineDistance*XOffset, LineDistance*YOffset, LineDistance*i+LineDistance*XOffset, h+aGroupPoints[3]);
		Graphics()->LinesDraw(&Line, 1);
	}
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	Graphics()->LinesEnd();
}